

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b4885::____C_A_T_C_H____T_E_S_T____22::test(____C_A_T_C_H____T_E_S_T____22 *this)

{
  int iVar1;
  Family FVar2;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var3;
  undefined4 extraout_var;
  IResultCapture *pIVar4;
  socklen_t __len;
  EntityCreatedEventReceiver *pEVar5;
  sockaddr *__addr;
  bool bVar6;
  EventCallbackWrapper<entityx::EntityCreatedEvent> wrapper;
  EventSignalPtr sig;
  _Any_data local_108;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_f8;
  undefined8 local_f0;
  undefined1 local_e8 [9];
  undefined7 uStack_df;
  _Any_data *local_d8;
  _Invoker_type p_Stack_d0;
  undefined8 local_c8;
  long *local_c0;
  undefined8 local_b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  long local_a8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  undefined8 local_98;
  EntityCreatedEventReceiver receiver;
  
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_buckets = &receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_.
                _M_h._M_single_bucket;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_bucket_count = 1;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_element_count = 0;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver._vptr_BaseReceiver =
       (_func_int **)&PTR__EntityCreatedEventReceiver_0020b450;
  receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar2 = entityx::Event<entityx::EntityCreatedEvent>::family();
  p_Var3 = &entityx::EventManager::signal_for((EventManager *)this,FVar2)->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  Catch::clara::std::
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&sig.
                  super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,p_Var3);
  local_e8._0_8_ = (void *)0x0;
  stack0xffffffffffffff20 = 0;
  local_d8 = (_Any_data *)0x0;
  p_Stack_d0 = (_Invoker_type)0x0;
  local_e8._0_8_ = operator_new(0x18);
  *(code **)local_e8._0_8_ =
       (anonymous_namespace)::____C_A_T_C_H____T_E_S_T____22::test()::EntityCreatedEventReceiver::
       receive(entityx::EntityCreatedEvent_const__;
  *(undefined8 *)(local_e8._0_8_ + 8) = 0;
  pEVar5 = &receiver;
  *(EntityCreatedEventReceiver **)(local_e8._0_8_ + 0x10) = pEVar5;
  p_Stack_d0 = Catch::clara::std::
               _Function_handler<void_(const_entityx::EntityCreatedEvent_&),_std::_Bind<void_(EntityCreatedEventReceiver::*(EntityCreatedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityCreatedEvent_&)>_>
               ::_M_invoke;
  local_d8 = (_Any_data *)
             Catch::clara::std::
             _Function_handler<void_(const_entityx::EntityCreatedEvent_&),_std::_Bind<void_(EntityCreatedEventReceiver::*(EntityCreatedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityCreatedEvent_&)>_>
             ::_M_manager;
  Catch::clara::std::function<void_(const_entityx::EntityCreatedEvent_&)>::function
            (&wrapper.callback,(function<void_(const_entityx::EntityCreatedEvent_&)> *)local_e8);
  __len = (socklen_t)pEVar5;
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)local_e8);
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::EntityCreatedEvent>&,void>
            ((function<void(void_const*)> *)local_108._M_pod_data,&wrapper);
  iVar1 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          connect(&(sig.
                    super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->
                   super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,
                  (int)&local_108,__addr,__len);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_108);
  FVar2 = entityx::Event<entityx::EntityCreatedEvent>::family();
  std::
  __weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
  ::__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,void>
            ((__weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_b8,
             &sig.
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  local_108._8_4_ = (undefined4)local_b8;
  local_108._12_4_ = local_b8._4_4_;
  _Stack_f8._M_pi._0_4_ = _Stack_b0._M_pi._0_4_;
  _Stack_f8._M_pi._4_4_ = _Stack_b0._M_pi._4_4_;
  local_b8 = 0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8 = 0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._M_unused._M_member_pointer = FVar2;
  local_f0 = CONCAT44(extraout_var,iVar1);
  local_98 = CONCAT44(extraout_var,iVar1);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&receiver.super_Receiver<EntityCreatedEventReceiver>.super_BaseReceiver.connections_
             ,&local_108);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_f8);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_a0);
  Catch::clara::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_b0);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&wrapper);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sig.
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  wrapper.callback.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_b59f3;
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x135;
  pIVar4 = Catch::getResultCapture();
  local_108._M_unused._M_object = (void *)0x0;
  uStack_df._0_1_ =
       (long)receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
             _M_impl.super__Vector_impl_data._M_start == 0;
  local_a8 = (long)receiver.created.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiver.created.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4;
  local_e8[8] = 1;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020d6c8;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_d8 = &local_108;
  local_c0 = &local_a8;
  (*pIVar4->_vptr_IResultCapture[10])(pIVar4,&wrapper);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  iVar1 = 10;
  while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
    entityx::EntityManager::create(&(this->super_EntityManagerFixture).em);
  }
  wrapper.callback.super__Function_base._M_functor._M_unused._M_object = anon_var_dwarf_b59f3;
  wrapper.callback.super__Function_base._M_functor._8_8_ = 7;
  wrapper.callback.super__Function_base._M_manager = (_Manager_type)anon_var_dwarf_b4855;
  wrapper.callback._M_invoker = (_Invoker_type)0x139;
  pIVar4 = Catch::getResultCapture();
  local_a8 = (long)receiver.created.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiver.created.
                   super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4;
  uStack_df._0_1_ =
       (long)receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)receiver.created.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
             _M_impl.super__Vector_impl_data._M_start == 0xa0;
  local_e8[8] = 1;
  local_108._M_unused._M_member_pointer = 10;
  local_e8._0_8_ = &PTR_streamReconstructedExpression_0020d6c8;
  local_d8 = &local_108;
  p_Stack_d0 = (_Invoker_type)0x1d838b;
  local_c8 = 2;
  local_c0 = &local_a8;
  (*pIVar4->_vptr_IResultCapture[10])(pIVar4,&wrapper);
  Catch::AssertionHandler::complete((AssertionHandler *)&wrapper);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&wrapper);
  test::EntityCreatedEventReceiver::~EntityCreatedEventReceiver(&receiver);
  return;
}

Assistant:

void receive(const EntityCreatedEvent &event) {
      created.push_back(event.entity);
    }